

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_color_map.c
# Opt level: O3

int gdColorMapLookup(gdColorMap color_map,char *color_name,int *r,int *g,int *b)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  gdColorMapEntry *entries;
  gdColorMapEntry *pgVar4;
  int iVar5;
  
  pgVar4 = color_map.entries;
  if (color_map.num_entries < 1) {
    return 0;
  }
  iVar5 = color_map.num_entries + -1;
  iVar3 = 0;
  do {
    uVar2 = (uint)(iVar3 + iVar5) >> 1;
    iVar1 = strcmp(color_name,pgVar4[uVar2].color_name);
    if (iVar1 == 0) {
      *r = pgVar4[uVar2].red;
      *g = pgVar4[uVar2].green;
      *b = pgVar4[uVar2].blue;
      return 1;
    }
    if (iVar1 < 0) {
      iVar5 = uVar2 - 1;
    }
    else {
      iVar3 = uVar2 + 1;
    }
  } while (iVar3 <= iVar5);
  return 0;
}

Assistant:

BGD_DECLARE(int)
gdColorMapLookup(const gdColorMap color_map, const char *color_name, int *r, int *g, int *b)
{
	gdColorMapEntry *entries = color_map.entries;
	int low = 0;
	int high = color_map.num_entries - 1;
	while (low <= high) {
		int i = (low+high)/2;
		int result = strcmp(color_name, entries[i].color_name);
		if (result == 0) {
			*r = entries[i].red;
			*g = entries[i].green;
			*b = entries[i].blue;
			return 1;
		} else if (result < 0) {
			high = i - 1;
		} else {
			low = i + 1;
		}
	}
	return 0;
}